

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

sample_type __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
::do_regular(jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
             *this,int32_t qs,int32_t param_2,int32_t predicted,decoder_strategy *param_4)

{
  uint uVar1;
  int32_t iVar2;
  unsigned_short uVar3;
  int iVar4;
  int32_t k;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  context_regular_mode *this_00;
  ulong uVar9;
  
  iVar4 = -qs;
  if (0 < qs) {
    iVar4 = qs;
  }
  this_00 = (this->contexts_)._M_elems + iVar4;
  k = context_regular_mode::get_golomb_coding_parameter(this_00);
  uVar8 = (this->contexts_)._M_elems[iVar4].c_;
  uVar1 = (this->traits_).maximum_sample_value;
  if ((this->super_decoder_strategy).valid_bits_ < 8) {
    decoder_strategy::fill_read_cache(&this->super_decoder_strategy);
  }
  uVar9 = (this->super_decoder_strategy).read_cache_ >> 0x38;
  iVar2 = *(int32_t *)((long)k * 0x800 + 0x13d1dc + uVar9 * 8);
  if (iVar2 == 0) {
    uVar7 = decode_value(this,k,(this->traits_).limit,(this->traits_).quantized_bits_per_pixel);
    uVar7 = (int)uVar7 >> 1 ^ -(uVar7 & 1);
    uVar5 = -uVar7;
    if (0 < (int)uVar7) {
      uVar5 = uVar7;
    }
    if (0xffff < uVar5) {
      jls_codec<charls::default_traits<unsigned_short,unsigned_short>,charls::decoder_strategy>::
      do_regular();
    }
  }
  else {
    decoder_strategy::skip(&this->super_decoder_strategy,iVar2);
    uVar7 = *(uint *)(decoding_tables + uVar9 * 8 + (long)k * 0x800);
    uVar5 = -uVar7;
    if (0 < (int)uVar7) {
      uVar5 = uVar7;
    }
    if (0xfffe < uVar5) {
      __assert_fail("std::abs(error_value) < 65535",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                    ,0x13f,
                    "sample_type charls::jls_codec<charls::default_traits<unsigned short, unsigned short>, charls::decoder_strategy>::do_regular(const int32_t, int32_t, const int32_t, decoder_strategy *) [Traits = charls::default_traits<unsigned short, unsigned short>, Strategy = charls::decoder_strategy]"
                   );
    }
  }
  uVar5 = qs >> 0x1f;
  iVar2 = (this->traits_).near_lossless;
  if (k == 0) {
    uVar6 = 0;
    if (iVar2 == 0) {
      uVar6 = (this->contexts_)._M_elems[iVar4].n_ + (this->contexts_)._M_elems[iVar4].b_ * 2 + -1
              >> 0x1f;
    }
    uVar7 = uVar7 ^ uVar6;
  }
  uVar6 = ((uVar8 ^ uVar5) - uVar5) + predicted;
  uVar8 = 0;
  if (-1 < (int)uVar6) {
    uVar8 = uVar1;
  }
  if ((uVar6 & ~uVar1) == 0) {
    uVar8 = uVar6;
  }
  context_regular_mode::update_variables_and_bias
            (this_00,uVar7,iVar2,(this->traits_).reset_threshold);
  uVar3 = default_traits<unsigned_short,_unsigned_short>::fix_reconstructed_value
                    (&this->traits_,
                     ((this->traits_).near_lossless * 2 + 1) * ((uVar7 ^ uVar5) - uVar5) + uVar8);
  return uVar3;
}

Assistant:

do_regular(const int32_t qs, int32_t /*x*/, const int32_t predicted,
                                        decoder_strategy* /*template_selector*/)
    {
        const int32_t sign{bit_wise_sign(qs)};
        context_regular_mode& context{contexts_[apply_sign(qs, sign)]};
        const int32_t k{context.get_golomb_coding_parameter()};
        const int32_t predicted_value{traits_.correct_prediction(predicted + apply_sign(context.c(), sign))};

        int32_t error_value;
        const golomb_code& code = decoding_tables[k].get(Strategy::peek_byte());
        if (code.length() != 0)
        {
            Strategy::skip(code.length());
            error_value = code.value();
            ASSERT(std::abs(error_value) < 65535);
        }
        else
        {
            error_value = unmap_error_value(decode_value(k, traits_.limit, traits_.quantized_bits_per_pixel));
            if (UNLIKELY(std::abs(error_value) > 65535))
                impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);
        }
        if (k == 0)
        {
            error_value = error_value ^ context.get_error_correction(traits_.near_lossless);
        }
        context.update_variables_and_bias(error_value, traits_.near_lossless, traits_.reset_threshold);
        error_value = apply_sign(error_value, sign);
        return traits_.compute_reconstructed_sample(predicted_value, error_value);
    }